

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuse.cpp
# Opt level: O3

Spectrum * __thiscall
phyr::DiffuseAreaLight::sample_li
          (Spectrum *__return_storage_ptr__,DiffuseAreaLight *this,Interaction *ref,Point2f *u,
          Vector3f *wi,double *pdf,VisibilityTester *vis)

{
  long lVar1;
  double *pdVar2;
  undefined8 *puVar3;
  byte bVar4;
  double dVar5;
  double local_148;
  double dStack_140;
  double local_138;
  undefined1 local_e8 [16];
  double local_d8;
  undefined8 local_88 [12];
  
  bVar4 = 0;
  (*((this->shape).super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Shape
    [9])(&local_148);
  if ((*pdf != 0.0) || (NAN(*pdf))) {
    local_138 = local_138 - (ref->p).z;
    local_148 = local_148 - (ref->p).x;
    dStack_140 = dStack_140 - (ref->p).y;
    dVar5 = local_138 * local_138 + local_148 * local_148 + dStack_140 * dStack_140;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar5 = 1.0 / SQRT(dVar5);
      wi->x = local_148 * dVar5;
      wi->y = dStack_140 * dVar5;
      wi->z = local_138 * dVar5;
      pdVar2 = (double *)local_e8;
      for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
        *pdVar2 = (ref->p).x;
        ref = (Interaction *)((long)ref + (ulong)bVar4 * -0x10 + 8);
        pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
      }
      pdVar2 = &local_148;
      puVar3 = local_88;
      for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *pdVar2;
        pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
        puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
      }
      memcpy(vis,local_e8,0xc0);
      local_d8 = -wi->z;
      local_e8._8_4_ = SUB84(wi->y,0);
      local_e8._0_8_ = -wi->x;
      local_e8._12_4_ = (uint)((ulong)wi->y >> 0x20) ^ 0x80000000;
      (*(this->super_AreaLight).super_Light._vptr_Light[9])
                (__return_storage_ptr__,this,&local_148,local_e8);
      return __return_storage_ptr__;
    }
  }
  *pdf = 0.0;
  memset(__return_storage_ptr__,0,0x1e0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum DiffuseAreaLight::sample_li(const Interaction& ref, const Point2f& u,
                                     Vector3f* wi, Real* pdf,
                                     VisibilityTester* vis) const {
    Interaction pShape = shape->sample(ref, u, pdf);
    if (*pdf == 0 || (pShape.p - ref.p).lengthSquared() == 0) {
        *pdf = 0;
        return 0.f;
    }
    *wi = normalize(pShape.p - ref.p);
    *vis = VisibilityTester(ref, pShape);
    return l(pShape, -*wi);
}